

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  xmlChar *content_local;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if ((doc == (xmlDocPtr)0x0) || (doc->intSubset == (_xmlDtd *)0x0)) {
    if (name == (xmlChar *)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local = (xmlDocPtr)xmlCreateEntity(doc,name,type,ExternalID,SystemID,content);
    }
  }
  else {
    doc_local = (xmlDocPtr)xmlAddDocEntity(doc,name,type,ExternalID,SystemID,content);
  }
  return (xmlEntityPtr)doc_local;
}

Assistant:

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc, const xmlChar *name, int type,
	     const xmlChar *ExternalID, const xmlChar *SystemID,
	     const xmlChar *content) {
    if ((doc != NULL) && (doc->intSubset != NULL)) {
	return(xmlAddDocEntity(doc, name, type, ExternalID, SystemID, content));
    }
    if (name == NULL)
        return(NULL);
    return(xmlCreateEntity(doc, name, type, ExternalID, SystemID, content));
}